

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int session_predicate_response_headers_send(nghttp2_session *session,nghttp2_stream *stream)

{
  int iVar1;
  int iVar2;
  
  if (stream == (nghttp2_stream *)0x0) {
    return -0x1fe;
  }
  iVar1 = session_is_closing(session);
  iVar2 = -0x212;
  if ((iVar1 == 0) && (iVar2 = -0x200, (stream->shut_flags & 2) == 0)) {
    if (session->server == '\0') {
      iVar2 = -0x1f9;
    }
    else {
      iVar2 = -0x201;
      if (stream->stream_id == 0 || (stream->stream_id & 1U) != 0) {
        iVar2 = 0;
        if (stream->state != NGHTTP2_STREAM_OPENING) {
          iVar2 = (uint)(stream->state == NGHTTP2_STREAM_CLOSING) * 3 + -0x202;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int session_predicate_for_stream_send(nghttp2_session *session,
                                             nghttp2_stream *stream) {
  if (stream == NULL) {
    return NGHTTP2_ERR_STREAM_CLOSED;
  }
  if (session_is_closing(session)) {
    return NGHTTP2_ERR_SESSION_CLOSING;
  }
  if (stream->shut_flags & NGHTTP2_SHUT_WR) {
    return NGHTTP2_ERR_STREAM_SHUT_WR;
  }
  return 0;
}